

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O0

void __thiscall matrix_sparse_row_test_at_Test::TestBody(matrix_sparse_row_test_at_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> row_00;
  reference_value pdVar4;
  char *pcVar5;
  char *regex;
  char *regex_00;
  char *regex_01;
  CSR_Data<double,_int> *matrix;
  AssertHelper local_238;
  Message local_230 [6];
  exception *gtest_exception_2;
  ReturnSentinel local_1f8;
  ReturnSentinel gtest_sentinel_2;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_2;
  pointer local_1d0;
  DeathTest *gtest_dt_2;
  Message local_1c0 [6];
  exception *gtest_exception_1;
  ReturnSentinel local_188;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_160;
  DeathTest *gtest_dt_1;
  Message local_150;
  int local_144;
  exception *gtest_exception;
  ReturnSentinel local_110;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_e8;
  DeathTest *gtest_dt;
  double remove_warning;
  Message local_d0;
  index_type local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  index_type local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  index_type local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  undefined1 local_40 [8];
  Matrix_Sparse_Row<double,_int> row;
  matrix_sparse_row_test_at_Test *this_local;
  
  matrix = &(this->super_matrix_sparse_row_test).csr_data;
  row.value._M_extent._M_extent_value = (size_t)this;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::vector<int,_std::allocator<int>_>::begin(&matrix->row_offset);
  row_00 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                     ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                      &gtest_ar.message_,2);
  Disa::Matrix_Sparse_Row<double,_int>::Matrix_Sparse_Row
            ((Matrix_Sparse_Row<double,_int> *)local_40,matrix,(index_iterator)row_00._M_current);
  local_64 = 1;
  pdVar4 = Disa::Matrix_Sparse_Row<double,_int>::at
                     ((Matrix_Sparse_Row<double,_int> *)local_40,&local_64);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_60,"row.at(1)","3.0",*pdVar4,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xfa,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_9c = 3;
  pdVar4 = Disa::Matrix_Sparse_Row<double,_int>::at
                     ((Matrix_Sparse_Row<double,_int> *)local_40,&local_9c);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_98,"row.at(3)","4.0",*pdVar4,4.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xfb,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_c4 = 4;
  pdVar4 = Disa::Matrix_Sparse_Row<double,_int>::at
                     ((Matrix_Sparse_Row<double,_int> *)local_40,&local_c4);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c0,"row.at(4)","5.0",*pdVar4,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&remove_warning,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xfc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&remove_warning,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&remove_warning);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  gtest_dt = (DeathTest *)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("remove_warning = row.at(0)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0xff,&local_e8);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0011552a;
    if (local_e8 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_e8);
      iVar2 = (*local_e8->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_e8->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_e8->_vptr_DeathTest[4])(local_e8,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_001154ec;
        local_144 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_110,local_e8);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            gtest_exception._4_4_ = 0;
            pdVar4 = Disa::Matrix_Sparse_Row<double,_int>::at
                               ((Matrix_Sparse_Row<double,_int> *)local_40,
                                (index_type *)((long)&gtest_exception + 4));
            gtest_dt = (DeathTest *)*pdVar4;
          }
          (*local_e8->_vptr_DeathTest[5])(local_e8,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_110);
        }
LAB_001154ec:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_144 != 0) goto LAB_0011552a;
    }
  }
  else {
LAB_0011552a:
    testing::Message::Message(&local_150);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xff,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_150);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)"./*",regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("remove_warning = row.at(2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0x100,&local_160);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00115977;
    if (local_160 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_160);
      iVar2 = (*local_160->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_160->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_160->_vptr_DeathTest[4])(local_160,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00115939;
        local_144 = 4;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_188,local_160);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            gtest_exception_1._4_4_ = 2;
            pdVar4 = Disa::Matrix_Sparse_Row<double,_int>::at
                               ((Matrix_Sparse_Row<double,_int> *)local_40,
                                (index_type *)((long)&gtest_exception_1 + 4));
            gtest_dt = (DeathTest *)*pdVar4;
          }
          (*local_160->_vptr_DeathTest[5])(local_160,2);
          local_144 = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_188);
        }
LAB_00115939:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_144 != 0) goto LAB_00115977;
    }
  }
  else {
LAB_00115977:
    testing::Message::Message(local_1c0);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x100,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_2,local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_2);
    testing::Message::~Message(local_1c0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) goto LAB_00115dc4;
  testing::internal::MakeDeathTestMatcher_abi_cxx11_
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&gtest_dt_ptr_2,(internal *)"./*",regex_01);
  bVar1 = testing::internal::DeathTest::Create
                    ("remove_warning = row.at(5)",
                     (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&gtest_dt_ptr_2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                     ,0x101,&local_1d0);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)&gtest_dt_ptr_2);
  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00115dc4;
  if (local_1d0 == (pointer)0x0) {
    return;
  }
  std::unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
  unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
            ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
              *)&gtest_sentinel_2,local_1d0);
  iVar2 = (*local_1d0->_vptr_DeathTest[2])();
  if (iVar2 == 0) {
    iVar2 = (*local_1d0->_vptr_DeathTest[3])();
    bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
    uVar3 = (*local_1d0->_vptr_DeathTest[4])(local_1d0,(ulong)bVar1);
    if ((uVar3 & 1) != 0) goto LAB_00115d86;
    local_144 = 6;
  }
  else {
    if (iVar2 == 1) {
      testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_1f8,local_1d0);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        gtest_exception_2._4_4_ = 5;
        pdVar4 = Disa::Matrix_Sparse_Row<double,_int>::at
                           ((Matrix_Sparse_Row<double,_int> *)local_40,
                            (index_type *)((long)&gtest_exception_2 + 4));
        gtest_dt = (DeathTest *)*pdVar4;
      }
      (*local_1d0->_vptr_DeathTest[5])(local_1d0,2);
      local_144 = 7;
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_1f8);
    }
LAB_00115d86:
    local_144 = 0;
  }
  std::unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  ::~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                 *)&gtest_sentinel_2);
  if (local_144 == 0) {
    return;
  }
LAB_00115dc4:
  testing::Message::Message(local_230);
  pcVar5 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_238,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
             ,0x101,pcVar5);
  testing::internal::AssertHelper::operator=(&local_238,local_230);
  testing::internal::AssertHelper::~AssertHelper(&local_238);
  testing::Message::~Message(local_230);
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, at) {
  Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 2);

  EXPECT_DOUBLE_EQ(row.at(1), 3.0);
  EXPECT_DOUBLE_EQ(row.at(3), 4.0);
  EXPECT_DOUBLE_EQ(row.at(4), 5.0);

  double remove_warning = 0;
  EXPECT_DEATH(remove_warning = row.at(0), "./*");
  EXPECT_DEATH(remove_warning = row.at(2), "./*");
  EXPECT_DEATH(remove_warning = row.at(5), "./*");
}